

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locgen.cpp
# Opt level: O2

void height_amount_widget_set_proc(Am_Object *cmd)

{
  int iVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Ptr pvVar4;
  ostream *poVar5;
  Am_Object win;
  Am_Object AStack_28;
  Am_Object local_20;
  
  Am_Object::Get_Object(&AStack_28,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)&AStack_28);
  Am_Object::~Am_Object(&AStack_28);
  pAVar3 = Am_Object::Get(cmd,0x169,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = Am_Object::Get(&local_20,0xfa,0);
  pvVar4 = Am_Value::operator_cast_to_void_(pAVar3);
  Am_Object::Get_Object(&AStack_28,(Am_Slot_Key)&local_20,(ulong)Am_HEIGHT_HOW);
  pAVar3 = Am_Object::Get(&AStack_28,0x169,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  Am_Object::~Am_Object(&AStack_28);
  if (1 < iVar2 - 0x65U) {
    if (iVar2 == 10) {
      *(int *)((long)pvVar4 + 0x40) = iVar1;
    }
    else if (iVar2 == 0xb) {
      *(int *)((long)pvVar4 + 0x44) = iVar1;
    }
    else if (iVar2 == 0x16) {
      *(int *)((long)pvVar4 + 0x48) = iVar1;
    }
    else {
      if (iVar2 != 0x17) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
        poVar5 = std::operator<<(poVar5,"Bad type for height control ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
        std::endl<char,std::char_traits<char>>(poVar5);
        Am_Error();
      }
      *(int *)((long)pvVar4 + 0x4c) = iVar1;
    }
  }
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, height_amount_widget_set,
                 (Am_Object cmd))
{
  Am_Object win = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  int new_val = cmd.Get(Am_VALUE);
  am_loc_values *loc_values = (am_loc_values *)(Am_Ptr)win.Get(Am_VALUES);
  int height_control = win.Get_Object(Am_HEIGHT_HOW).Get(Am_VALUE);
  switch (height_control) {
  case am_change_equals:
    loc_values->height_equals = new_val;
    break;
  case am_change_offset:
    loc_values->height_offset = new_val;
    break;
  case am_ask_user_generalize:
    break; //shouldn't happen
  case am_ask_user_type:
    break; //shouldn't happen
  case am_change_object_wh:
    loc_values->height_object_offset = new_val;
    break;
  case am_change_object_percent:
    loc_values->height_object_percent = new_val;
    break;
  default:
    Am_ERROR("Bad type for height control " << height_control);
  } //end switch
}